

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btConvexHull.cpp
# Opt level: O0

int above(btVector3 *vertices,int3 *t,btVector3 *p,btScalar epsilon)

{
  int3 *in_RSI;
  btVector3 *in_RDI;
  float in_XMM0_Da;
  btScalar bVar1;
  btVector3 n;
  btVector3 *in_stack_ffffffffffffff78;
  btVector3 *v1;
  btVector3 *v2;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  btVector3 *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  v1 = in_RDI;
  int3::operator[](in_RSI,0);
  v2 = in_RDI;
  int3::operator[](in_RSI,1);
  int3::operator[](in_RSI,2);
  TriNormal((btVector3 *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
            in_stack_ffffffffffffffc8,
            (btVector3 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  int3::operator[](in_RSI,0);
  operator-(in_RDI,v2);
  bVar1 = btDot(v1,in_stack_ffffffffffffff78);
  return (int)(in_XMM0_Da < bVar1);
}

Assistant:

int above(btVector3* vertices,const int3& t, const btVector3 &p, btScalar epsilon) 
{
	btVector3 n=TriNormal(vertices[t[0]],vertices[t[1]],vertices[t[2]]);
	return (btDot(n,p-vertices[t[0]]) > epsilon); // EPSILON???
}